

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O3

void __thiscall UdpReceiver::UdpReceiver(UdpReceiver *this,int port,int bufferSize)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  UdpReceiver *this_00;
  anon_class_16_2_8a47e332_for_handler_ aStack_30;
  UdpReceiver *pUStack_20;
  
  this->port = port;
  this->bufferSize = bufferSize;
  pcVar3 = (char *)calloc((long)bufferSize,1);
  this->buffer = pcVar3;
  this_00 = (UdpReceiver *)0x2;
  iVar2 = socket(2,2,0);
  this->socketFile = iVar2;
  if (iVar2 < 0) {
    UdpReceiver(this_00);
  }
  else {
    this->socketOptions = 1;
    setsockopt(iVar2,1,6,&this->socketOptions,4);
    (this->serverAddress).sin_zero[0] = '\0';
    (this->serverAddress).sin_zero[1] = '\0';
    (this->serverAddress).sin_zero[2] = '\0';
    (this->serverAddress).sin_zero[3] = '\0';
    (this->serverAddress).sin_zero[4] = '\0';
    (this->serverAddress).sin_zero[5] = '\0';
    (this->serverAddress).sin_zero[6] = '\0';
    (this->serverAddress).sin_zero[7] = '\0';
    (this->serverAddress).sin_family = 2;
    (this->serverAddress).sin_addr.s_addr = 0;
    uVar1 = (ushort)this->port;
    (this->serverAddress).sin_port = uVar1 << 8 | uVar1 >> 8;
    this_00 = (UdpReceiver *)(ulong)(uint)this->socketFile;
    iVar2 = bind(this->socketFile,(sockaddr *)&this->serverAddress,0x10);
    if (-1 < iVar2) {
      this->clientLength = 0x10;
      return;
    }
  }
  UdpReceiver(this_00);
  *(undefined1 *)&this_00->socketFile = 1;
  pUStack_20 = this;
  ableton::Link::Link((Link *)&this_00->bufferSize,120.0);
  LOCK();
  iVar2 = this_00[5].socketFile;
  *(undefined1 *)&this_00[5].socketFile = 1;
  UNLOCK();
  if ((iVar2 & 1) == 0) {
    aStack_30.this =
         (Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
          *)this_00[1].serverAddress.sin_zero;
    aStack_30.bEnable = true;
    asio::io_context::
    post<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::enable(bool)::_lambda()_1_>
              (*(io_context **)&this_00[5].bufferSize,&aStack_30);
  }
  this_00[0x11].clientIP = (char *)0x4010000000000000;
  return;
}

Assistant:

UdpReceiver(int port, int bufferSize) {
      this->port = port;
      this->bufferSize = bufferSize;
      this->buffer = (char*)calloc(this->bufferSize, sizeof(char));
      // create socket
      this->socketFile = socket(AF_INET, SOCK_DGRAM, 0);
      if(this->socketFile < 0) error("ERROR: Could not open socket\n");
      // speedhax
      this->socketOptions = 1;
      setsockopt( this->socketFile,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  (const void*)&this->socketOptions,
                  sizeof(int));
      // construct server address
      bzero((char*)&this->serverAddress, sizeof(this->serverAddress));
      this->serverAddress.sin_family = AF_INET;
      this->serverAddress.sin_addr.s_addr = htonl(INADDR_ANY);
      this->serverAddress.sin_port = htons((unsigned short)this->port);
      // bind socket
      if(bind(this->socketFile,
              (struct sockaddr *)&this->serverAddress,
              sizeof(this->serverAddress)) < 0)
        error("ERROR: There was an issue binding the socket");
      this->clientLength = sizeof(this->clientAddress);
    }